

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

void sexp_string_utf8_set(sexp ctx,sexp str,sexp index,sexp ch)

{
  sexp *ppsVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int len;
  sexp psVar5;
  int iVar6;
  int c;
  size_t __n;
  byte *pbVar7;
  byte *pbVar8;
  
  auVar2._8_8_ = (long)index >> 0x3f;
  auVar2._0_8_ = (ulong)index & 0xfffffffffffffffd;
  iVar3 = SUB164(auVar2 / SEXT816(8),0);
  __n = (size_t)iVar3;
  pbVar7 = (byte *)((((str->value).type.cpl)->value).flonum_bits +
                   (long)&((str->value).type.name)->value + __n);
  iVar4 = sexp_utf8_initial_byte_count((uint)*pbVar7);
  c = (int)((ulong)ch >> 8);
  len = sexp_utf8_char_byte_count(c);
  pbVar8 = pbVar7;
  if (((str->field_0x5 & 0x10) != 0) || (len != iVar4)) {
    iVar6 = *(int *)((long)&str->value + 0x10) + (len - iVar4);
    psVar5 = sexp_make_bytes_op(ctx,(sexp)0x0,2,(sexp)((long)iVar6 * 2 + 1),(sexp)&DAT_0000043e);
    if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
      memcpy((void *)((long)&psVar5->value + 8),
             (void *)((long)&((str->value).type.cpl)->value + (long)&((str->value).type.name)->value
                     ),__n);
      pbVar8 = (byte *)((psVar5->value).flonum_bits + __n + 8);
      memcpy(pbVar8 + len,pbVar7 + iVar4,(long)((iVar6 - (iVar3 + len)) + 1));
      (str->value).type.name = psVar5;
    }
    ppsVar1 = &(str->value).type.slots;
    *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + (long)(len - iVar4));
    str->field_0x5 = str->field_0x5 & 0xef;
  }
  sexp_utf8_encode_char(pbVar8,len,c);
  return;
}

Assistant:

void sexp_string_utf8_set (sexp ctx, sexp str, sexp index, sexp ch) {
  sexp b;
  unsigned char *p, *q;
  int i = sexp_unbox_string_cursor(index), c = sexp_unbox_character(ch),
    old_len, new_len, len;
  p = (unsigned char*)sexp_string_data(str) + i;
  old_len = sexp_utf8_initial_byte_count(*p);
  new_len = sexp_utf8_char_byte_count(c);
  if (sexp_copy_on_writep(str) || old_len != new_len) { /* resize bytes if needed */
    len = sexp_string_size(str)+(new_len-old_len);
    b = sexp_make_bytes(ctx, sexp_make_fixnum(len), SEXP_VOID);
    if (! sexp_exceptionp(b)) {
      q = (unsigned char*)sexp_bytes_data(b);
      memcpy(q, sexp_string_data(str), i);
      memcpy(q+i+new_len, p+old_len, len-i-new_len+1);
      sexp_string_bytes(str) = b;
      p = q + i;
    }
    sexp_string_size(str) += new_len - old_len;
    sexp_copy_on_writep(str) = 0;
  }
  sexp_utf8_encode_char(p, new_len, c);
  if (old_len != new_len) {
#if SEXP_USE_STRING_INDEX_TABLE
    sexp_update_string_index_lookup(ctx, str);
#elif SEXP_USE_STRING_REF_CACHE
  sexp_cached_char_idx(str) = 0;
  sexp_cached_cursor(str) = sexp_make_string_cursor(0);
#endif
  }
}